

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O1

bool __thiscall wallet::CWallet::EncryptWallet(CWallet *this,SecureString *strWalletPassphrase)

{
  _Rb_tree_header *p_Var1;
  WalletDatabase *pWVar2;
  _Head_base<0UL,_wallet::DatabaseBatch_*,_false> _Var3;
  bool bVar4;
  char cVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  mapped_type *this_00;
  WalletBatch *this_01;
  _Base_ptr p_Var10;
  LegacyScriptPubKeyMan *pLVar11;
  ulong uVar12;
  pointer *__ptr;
  long in_FS_OFFSET;
  Span<unsigned_char> bytes;
  Span<unsigned_char> bytes_00;
  span<const_unsigned_char,_18446744073709551615UL> salt;
  span<const_unsigned_char,_18446744073709551615UL> salt_00;
  span<const_unsigned_char,_18446744073709551615UL> salt_01;
  CKeyingMaterial _vMasterKey;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  CCrypter crypter;
  CMasterKey local_f8;
  _Vector_base<unsigned_char,_secure_allocator<unsigned_char>_> local_a8;
  unique_lock<std::recursive_mutex> local_90;
  unique_lock<std::recursive_mutex> local_80;
  CCrypter local_70;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->mapMasterKeys)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    bVar4 = false;
    goto LAB_0051631e;
  }
  local_a8._M_impl.super__Vector_impl_data._M_start = (uchar *)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_secure_allocator<unsigned_char>_> *)&local_a8,0x20);
  bytes.m_size = (long)local_a8._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_a8._M_impl.super__Vector_impl_data._M_start;
  bytes.m_data = local_a8._M_impl.super__Vector_impl_data._M_start;
  GetStrongRandBytes(bytes);
  CMasterKey::CMasterKey(&local_f8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_f8.vchSalt,8);
  bytes_00.m_size =
       (long)local_f8.vchSalt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)local_f8.vchSalt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
  bytes_00.m_data =
       local_f8.vchSalt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  GetStrongRandBytes(bytes_00);
  CCrypter::CCrypter(&local_70);
  lVar8 = std::chrono::_V2::steady_clock::now();
  salt._M_extent._M_extent_value =
       (long)local_f8.vchSalt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)local_f8.vchSalt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
  salt._M_ptr = local_f8.vchSalt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
  CCrypter::SetKeyFromPassphrase
            (&local_70,strWalletPassphrase,salt,25000,local_f8.nDerivationMethod);
  lVar9 = std::chrono::_V2::steady_clock::now();
  local_f8.nDeriveIterations = (uint)(long)(2500000000000.0 / (double)(lVar9 - lVar8));
  lVar8 = std::chrono::_V2::steady_clock::now();
  salt_00._M_extent._M_extent_value =
       (long)local_f8.vchSalt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)local_f8.vchSalt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
  salt_00._M_ptr =
       local_f8.vchSalt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  CCrypter::SetKeyFromPassphrase
            (&local_70,strWalletPassphrase,salt_00,local_f8.nDeriveIterations,
             local_f8.nDerivationMethod);
  uVar6 = local_f8.nDeriveIterations;
  uVar12 = (ulong)local_f8.nDeriveIterations;
  lVar9 = std::chrono::_V2::steady_clock::now();
  uVar6 = (int)(long)(((double)uVar12 * 100.0 * 1000000.0) / (double)(lVar9 - lVar8)) + uVar6;
  local_f8.nDeriveIterations = 25000;
  if (49999 < uVar6) {
    local_f8.nDeriveIterations = uVar6 >> 1;
  }
  WalletLogPrintf<unsigned_int>
            (this,(ConstevalFormatString<1U>)0x8420b5,&local_f8.nDeriveIterations);
  salt_01._M_extent._M_extent_value =
       (long)local_f8.vchSalt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)local_f8.vchSalt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
  salt_01._M_ptr =
       local_f8.vchSalt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  bVar4 = CCrypter::SetKeyFromPassphrase
                    (&local_70,strWalletPassphrase,salt_01,local_f8.nDeriveIterations,
                     local_f8.nDerivationMethod);
  if (bVar4) {
    bVar4 = CCrypter::Encrypt(&local_70,(CKeyingMaterial *)&local_a8,&local_f8.vchCryptedKey);
    if (!bVar4) goto LAB_005162c0;
    local_80._M_device = &(this->m_relock_mutex).super_recursive_mutex;
    local_80._M_owns = false;
    std::unique_lock<std::recursive_mutex>::lock(&local_80);
    local_90._M_device = &(this->cs_wallet).super_recursive_mutex;
    local_90._M_owns = false;
    std::unique_lock<std::recursive_mutex>::lock(&local_90);
    this->nMasterKeyMaxID = this->nMasterKeyMaxID + 1;
    this_00 = std::
              map<unsigned_int,_wallet::CMasterKey,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wallet::CMasterKey>_>_>
              ::operator[](&this->mapMasterKeys,&this->nMasterKeyMaxID);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&this_00->vchCryptedKey,&local_f8.vchCryptedKey);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&this_00->vchSalt,&local_f8.vchSalt);
    this_00->nDerivationMethod = local_f8.nDerivationMethod;
    this_00->nDeriveIterations = local_f8.nDeriveIterations;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&this_00->vchOtherDerivationParameters,&local_f8.vchOtherDerivationParameters);
    this_01 = (WalletBatch *)operator_new(0x10);
    pWVar2 = (this->m_database)._M_t.
             super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
             ._M_t.
             super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
             .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl;
    if (pWVar2 == (WalletDatabase *)0x0) goto LAB_00516418;
    (*pWVar2->_vptr_WalletDatabase[0xe])(this_01,pWVar2,1);
    this_01->m_database = pWVar2;
    bVar4 = WalletBatch::TxnBegin(this_01);
    if (!bVar4) {
      _Var3._M_head_impl =
           (this_01->m_batch)._M_t.
           super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
           ._M_t.
           super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
           .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl;
      if (_Var3._M_head_impl != (DatabaseBatch *)0x0) {
        (*(_Var3._M_head_impl)->_vptr_DatabaseBatch[5])();
      }
      (this_01->m_batch)._M_t.
      super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>._M_t
      .super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>.
      super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl = (DatabaseBatch *)0x0;
      operator_delete(this_01,0x10);
LAB_005162a9:
      std::unique_lock<std::recursive_mutex>::~unique_lock(&local_90);
      std::unique_lock<std::recursive_mutex>::~unique_lock(&local_80);
      goto LAB_005162c0;
    }
    WalletBatch::WriteMasterKey(this_01,this->nMasterKeyMaxID,&local_f8);
    p_Var10 = (this->m_spk_managers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->m_spk_managers)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var10 != p_Var1) {
      do {
        cVar5 = (**(code **)(**(long **)(p_Var10 + 2) + 0x28))
                          (*(long **)(p_Var10 + 2),&local_a8,this_01);
        if (cVar5 == '\0') {
          WalletBatch::TxnAbort(this_01);
          WalletBatch::~WalletBatch(this_01);
          operator_delete(this_01,0x10);
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
                        ,0x35a,"bool wallet::CWallet::EncryptWallet(const SecureString &)");
        }
        p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
      } while ((_Rb_tree_header *)p_Var10 != p_Var1);
    }
    SetMinVersion(this,FEATURE_WALLETCRYPT,this_01);
    bVar4 = WalletBatch::TxnCommit(this_01);
    if (!bVar4) {
      WalletBatch::~WalletBatch(this_01);
      operator_delete(this_01,0x10);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
                    ,0x366,"bool wallet::CWallet::EncryptWallet(const SecureString &)");
    }
    _Var3._M_head_impl =
         (this_01->m_batch)._M_t.
         super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
         _M_t.
         super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
         .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl;
    if (_Var3._M_head_impl != (DatabaseBatch *)0x0) {
      (*(_Var3._M_head_impl)->_vptr_DatabaseBatch[5])();
    }
    (this_01->m_batch)._M_t.
    super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>._M_t.
    super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>.
    super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl = (DatabaseBatch *)0x0;
    operator_delete(this_01,0x10);
    Lock(this);
    Unlock(this,strWalletPassphrase);
    if ((((this->m_wallet_flags).super___atomic_base<unsigned_long>._M_i >> 0x22 & 1) == 0) ||
       (((this->m_wallet_flags).super___atomic_base<unsigned_long>._M_i >> 0x21 & 1) != 0)) {
      pLVar11 = GetLegacyScriptPubKeyMan(this);
      if (pLVar11 != (LegacyScriptPubKeyMan *)0x0) {
        iVar7 = (*(pLVar11->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0xc])
                          (pLVar11);
        if ((char)iVar7 != '\0') {
          iVar7 = (*(pLVar11->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0xb]
                  )(pLVar11,1);
          if ((char)iVar7 == '\0') goto LAB_005162a9;
        }
      }
    }
    else {
      SetupDescriptorScriptPubKeyMans(this);
    }
    Lock(this);
    pWVar2 = (this->m_database)._M_t.
             super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
             ._M_t.
             super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
             .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl;
    if (pWVar2 == (WalletDatabase *)0x0) {
LAB_00516418:
      __assert_fail("static_cast<bool>(m_database)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.h"
                    ,0x1be,"virtual WalletDatabase &wallet::CWallet::GetDatabase() const");
    }
    (*pWVar2->_vptr_WalletDatabase[5])(pWVar2,0);
    pWVar2 = (this->m_database)._M_t.
             super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
             ._M_t.
             super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
             .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl;
    if (pWVar2 == (WalletDatabase *)0x0) goto LAB_00516418;
    (*pWVar2->_vptr_WalletDatabase[0xb])();
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_90);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_80);
    bVar4 = true;
    boost::signals2::
    signal<void_(wallet::CWallet_*),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(wallet::CWallet_*)>,_boost::function<void_(const_boost::signals2::connection_&,_wallet::CWallet_*)>,_boost::signals2::mutex>
    ::operator()(&this->NotifyStatusChanged,this);
  }
  else {
LAB_005162c0:
    bVar4 = false;
  }
  CCrypter::~CCrypter(&local_70);
  if (local_f8.vchOtherDerivationParameters.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.vchOtherDerivationParameters.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.vchOtherDerivationParameters.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.vchOtherDerivationParameters.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_f8.vchSalt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_f8.vchSalt.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.vchSalt.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.vchSalt.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_f8.vchCryptedKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.vchCryptedKey.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.vchCryptedKey.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.vchCryptedKey.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::_Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>::~_Vector_base(&local_a8);
LAB_0051631e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool CWallet::EncryptWallet(const SecureString& strWalletPassphrase)
{
    if (IsCrypted())
        return false;

    CKeyingMaterial _vMasterKey;

    _vMasterKey.resize(WALLET_CRYPTO_KEY_SIZE);
    GetStrongRandBytes(_vMasterKey);

    CMasterKey kMasterKey;

    kMasterKey.vchSalt.resize(WALLET_CRYPTO_SALT_SIZE);
    GetStrongRandBytes(kMasterKey.vchSalt);

    CCrypter crypter;
    constexpr MillisecondsDouble target{100};
    auto start{SteadyClock::now()};
    crypter.SetKeyFromPassphrase(strWalletPassphrase, kMasterKey.vchSalt, 25000, kMasterKey.nDerivationMethod);
    kMasterKey.nDeriveIterations = static_cast<unsigned int>(25000 * target / (SteadyClock::now() - start));

    start = SteadyClock::now();
    crypter.SetKeyFromPassphrase(strWalletPassphrase, kMasterKey.vchSalt, kMasterKey.nDeriveIterations, kMasterKey.nDerivationMethod);
    kMasterKey.nDeriveIterations = (kMasterKey.nDeriveIterations + static_cast<unsigned int>(kMasterKey.nDeriveIterations * target / (SteadyClock::now() - start))) / 2;

    if (kMasterKey.nDeriveIterations < 25000)
        kMasterKey.nDeriveIterations = 25000;

    WalletLogPrintf("Encrypting Wallet with an nDeriveIterations of %i\n", kMasterKey.nDeriveIterations);

    if (!crypter.SetKeyFromPassphrase(strWalletPassphrase, kMasterKey.vchSalt, kMasterKey.nDeriveIterations, kMasterKey.nDerivationMethod))
        return false;
    if (!crypter.Encrypt(_vMasterKey, kMasterKey.vchCryptedKey))
        return false;

    {
        LOCK2(m_relock_mutex, cs_wallet);
        mapMasterKeys[++nMasterKeyMaxID] = kMasterKey;
        WalletBatch* encrypted_batch = new WalletBatch(GetDatabase());
        if (!encrypted_batch->TxnBegin()) {
            delete encrypted_batch;
            encrypted_batch = nullptr;
            return false;
        }
        encrypted_batch->WriteMasterKey(nMasterKeyMaxID, kMasterKey);

        for (const auto& spk_man_pair : m_spk_managers) {
            auto spk_man = spk_man_pair.second.get();
            if (!spk_man->Encrypt(_vMasterKey, encrypted_batch)) {
                encrypted_batch->TxnAbort();
                delete encrypted_batch;
                encrypted_batch = nullptr;
                // We now probably have half of our keys encrypted in memory, and half not...
                // die and let the user reload the unencrypted wallet.
                assert(false);
            }
        }

        // Encryption was introduced in version 0.4.0
        SetMinVersion(FEATURE_WALLETCRYPT, encrypted_batch);

        if (!encrypted_batch->TxnCommit()) {
            delete encrypted_batch;
            encrypted_batch = nullptr;
            // We now have keys encrypted in memory, but not on disk...
            // die to avoid confusion and let the user reload the unencrypted wallet.
            assert(false);
        }

        delete encrypted_batch;
        encrypted_batch = nullptr;

        Lock();
        Unlock(strWalletPassphrase);

        // If we are using descriptors, make new descriptors with a new seed
        if (IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS) && !IsWalletFlagSet(WALLET_FLAG_BLANK_WALLET)) {
            SetupDescriptorScriptPubKeyMans();
        } else if (auto spk_man = GetLegacyScriptPubKeyMan()) {
            // if we are using HD, replace the HD seed with a new one
            if (spk_man->IsHDEnabled()) {
                if (!spk_man->SetupGeneration(true)) {
                    return false;
                }
            }
        }
        Lock();

        // Need to completely rewrite the wallet file; if we don't, bdb might keep
        // bits of the unencrypted private key in slack space in the database file.
        GetDatabase().Rewrite();

        // BDB seems to have a bad habit of writing old data into
        // slack space in .dat files; that is bad if the old data is
        // unencrypted private keys. So:
        GetDatabase().ReloadDbEnv();

    }
    NotifyStatusChanged(this);

    return true;
}